

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

char16 * Js::JavascriptString::AllocateAndCopySz
                   (ArenaAllocator *arena,char16 *content,charcount_t length)

{
  char16_t *dst;
  
  if (length < 0x7ffffffe) {
    dst = Memory::AllocateArray<Memory::ArenaAllocator,char16_t,false>
                    ((Memory *)arena,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                     (ulong)(length + 1));
    js_wmemcpy_s(dst,(ulong)(length + 1),content,(ulong)length);
    dst[length] = L'\0';
    return dst;
  }
  Throw::OutOfMemory();
}

Assistant:

char16* JavascriptString::AllocateAndCopySz(__in ArenaAllocator* arena, __in_ecount(length) const char16* content, charcount_t length)
    {
        // Note: Intentionally not using SafeSzSize nor hoisting common
        // sub-expression "length + 1" into a local variable otherwise
        // Prefast gets confused and cannot track buffer's length.

        // JavascriptString::MaxCharLength is valid; however, we are incrementing below by 1 and want to make sure we aren't overflowing
        // Nor going outside of valid range.
        if (length >= JavascriptString::MaxCharLength)
        {
            Throw::OutOfMemory();
        }

        // Allocate arena memory to store the string plus a terminating NUL
        char16* buffer = AnewArray(arena, char16, length + 1);
        js_wmemcpy_s(buffer, length + 1, content, length);
        buffer[length] = _u('\0');

        return buffer;
    }